

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void RD4_C(uint8_t *dst)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int D;
  int C;
  int B;
  int A;
  int X;
  int L;
  int K;
  int J;
  int I;
  uint8_t *dst_local;
  
  uVar2 = (uint)dst[-1];
  uVar3 = (uint)dst[0x1f];
  uVar4 = (uint)dst[-0x21];
  uVar5 = (uint)dst[-0x20];
  uVar6 = (uint)dst[-0x1f];
  dst[0x60] = (uint8_t)((int)(uVar3 + (uint)dst[0x3f] * 2 + (uint)dst[0x5f] + 2) >> 2);
  uVar1 = (uint8_t)((int)(uVar2 + uVar3 * 2 + (uint)dst[0x3f] + 2) >> 2);
  dst[0x40] = uVar1;
  dst[0x61] = uVar1;
  uVar1 = (uint8_t)((int)(uVar4 + uVar2 * 2 + uVar3 + 2) >> 2);
  dst[0x20] = uVar1;
  dst[0x41] = uVar1;
  dst[0x62] = uVar1;
  uVar1 = (uint8_t)((int)(uVar5 + uVar4 * 2 + uVar2 + 2) >> 2);
  *dst = uVar1;
  dst[0x21] = uVar1;
  dst[0x42] = uVar1;
  dst[99] = uVar1;
  uVar1 = (uint8_t)((int)(uVar6 + uVar5 * 2 + uVar4 + 2) >> 2);
  dst[1] = uVar1;
  dst[0x22] = uVar1;
  dst[0x43] = uVar1;
  uVar1 = (uint8_t)((int)((uint)dst[-0x1e] + uVar6 * 2 + uVar5 + 2) >> 2);
  dst[2] = uVar1;
  dst[0x23] = uVar1;
  dst[3] = (uint8_t)((int)((uint)dst[-0x1d] + (uint)dst[-0x1e] * 2 + uVar6 + 2) >> 2);
  return;
}

Assistant:

static void RD4_C(uint8_t* dst) {   // Down-right
  const int I = dst[-1 + 0 * BPS];
  const int J = dst[-1 + 1 * BPS];
  const int K = dst[-1 + 2 * BPS];
  const int L = dst[-1 + 3 * BPS];
  const int X = dst[-1 - BPS];
  const int A = dst[0 - BPS];
  const int B = dst[1 - BPS];
  const int C = dst[2 - BPS];
  const int D = dst[3 - BPS];
  DST(0, 3)                                     = AVG3(J, K, L);
  DST(1, 3) = DST(0, 2)                         = AVG3(I, J, K);
  DST(2, 3) = DST(1, 2) = DST(0, 1)             = AVG3(X, I, J);
  DST(3, 3) = DST(2, 2) = DST(1, 1) = DST(0, 0) = AVG3(A, X, I);
              DST(3, 2) = DST(2, 1) = DST(1, 0) = AVG3(B, A, X);
                          DST(3, 1) = DST(2, 0) = AVG3(C, B, A);
                                      DST(3, 0) = AVG3(D, C, B);
}